

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v4.cxx
# Opt level: O0

void __thiscall xray_re::xr_ogf_v4::load_gcontainer(xr_ogf_v4 *this,xr_reader *r)

{
  uint32_t uVar1;
  xr_reader *r_local;
  xr_ogf_v4 *this_local;
  
  uVar1 = xr_reader::r_u32(r);
  this->m_ext_vb_index = uVar1;
  uVar1 = xr_reader::r_u32(r);
  this->m_ext_vb_offset = uVar1;
  uVar1 = xr_reader::r_u32(r);
  this->m_ext_vb_size = uVar1;
  uVar1 = xr_reader::r_u32(r);
  this->m_ext_ib_index = uVar1;
  uVar1 = xr_reader::r_u32(r);
  this->m_ext_ib_offset = uVar1;
  uVar1 = xr_reader::r_u32(r);
  this->m_ext_ib_size = uVar1;
  xr_ogf::set_chunk_loaded(&this->super_xr_ogf,0x15);
  return;
}

Assistant:

void xr_ogf_v4::load_gcontainer(xr_reader& r)
{
	m_ext_vb_index = r.r_u32();
	m_ext_vb_offset = r.r_u32();
	m_ext_vb_size = r.r_u32();
	m_ext_ib_index = r.r_u32();
	m_ext_ib_offset = r.r_u32();
	m_ext_ib_size = r.r_u32();
	set_chunk_loaded(OGF4_GCONTAINER);
}